

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int type)

{
  pointer pnVar1;
  type_conflict5 tVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  int i;
  pointer pnVar9;
  undefined8 *puVar10;
  type *ptVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  multiprecision *pmVar13;
  type *ptVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  int i_1;
  byte bVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mindiag;
  cpp_dec_float<200U,_int,_void> local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absdiag;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxdiag;
  multiprecision local_1b0 [112];
  undefined4 local_140;
  undefined1 local_13c;
  undefined8 local_138;
  multiprecision local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  multiprecision local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar16 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_338,0.0,(type *)0x0);
  iVar3 = (*(this->
            super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SLinSolver[4])(this);
  if (iVar3 == 0) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&__return_storage_ptr__->m_backend,1.0,(type *)0x0);
  }
  else {
    if (type == 2) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_338,1.0);
      lVar5 = 0;
      lVar6 = 0;
      while( true ) {
        iVar3 = (*(this->
                  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SLinSolver[4])(this);
        if (iVar3 <= lVar6) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_338,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)(((this->
                            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).diag.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar5));
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x80;
      }
      maxdiag.m_backend.data._M_elems[0] = 0;
      maxdiag.m_backend.data._M_elems[1] = 0x3ff00000;
      mindiag.m_backend.fpclass = cpp_dec_float_finite;
      mindiag.m_backend.prec_elem = 0x1c;
      mindiag.m_backend.data._M_elems[0] = 0;
      mindiag.m_backend.data._M_elems[1] = 0;
      mindiag.m_backend.data._M_elems[2] = 0;
      mindiag.m_backend.data._M_elems[3] = 0;
      mindiag.m_backend.data._M_elems[4] = 0;
      mindiag.m_backend.data._M_elems[5] = 0;
      mindiag.m_backend.data._M_elems[6] = 0;
      mindiag.m_backend.data._M_elems[7] = 0;
      mindiag.m_backend.data._M_elems[8] = 0;
      mindiag.m_backend.data._M_elems[9] = 0;
      mindiag.m_backend.data._M_elems[10] = 0;
      mindiag.m_backend.data._M_elems[0xb] = 0;
      mindiag.m_backend.data._M_elems[0xc] = 0;
      mindiag.m_backend.data._M_elems[0xd] = 0;
      mindiag.m_backend.data._M_elems[0xe] = 0;
      mindiag.m_backend.data._M_elems[0xf] = 0;
      mindiag.m_backend.data._M_elems[0x10] = 0;
      mindiag.m_backend.data._M_elems[0x11] = 0;
      mindiag.m_backend.data._M_elems[0x12] = 0;
      mindiag.m_backend.data._M_elems[0x13] = 0;
      mindiag.m_backend.data._M_elems[0x14] = 0;
      mindiag.m_backend.data._M_elems[0x15] = 0;
      mindiag.m_backend.data._M_elems[0x16] = 0;
      mindiag.m_backend.data._M_elems[0x17] = 0;
      mindiag.m_backend.data._M_elems[0x18] = 0;
      mindiag.m_backend.data._M_elems[0x19] = 0;
      mindiag.m_backend.data._M_elems._104_5_ = 0;
      mindiag.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      mindiag.m_backend.exp = 0;
      mindiag.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                (&mindiag.m_backend,(double *)&maxdiag,&local_338);
      pcVar12 = &mindiag.m_backend;
      pcVar15 = &local_338;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar15->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar16 * -8 + 4);
      }
      local_338.exp = mindiag.m_backend.exp;
      local_338.neg = mindiag.m_backend.neg;
      local_338.fpclass = mindiag.m_backend.fpclass;
      local_338.prec_elem = mindiag.m_backend.prec_elem;
    }
    else if (type == 1) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_338,0.0);
      lVar5 = 0;
      lVar6 = 0;
      while( true ) {
        iVar3 = (*(this->
                  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SLinSolver[4])(this);
        if (iVar3 <= lVar6) break;
        maxdiag.m_backend.data._M_elems[0] = 0;
        maxdiag.m_backend.data._M_elems[1] = 0x3ff00000;
        mindiag.m_backend.fpclass = cpp_dec_float_finite;
        mindiag.m_backend.prec_elem = 0x1c;
        mindiag.m_backend.data._M_elems[0] = 0;
        mindiag.m_backend.data._M_elems[1] = 0;
        mindiag.m_backend.data._M_elems[2] = 0;
        mindiag.m_backend.data._M_elems[3] = 0;
        mindiag.m_backend.data._M_elems[4] = 0;
        mindiag.m_backend.data._M_elems[5] = 0;
        mindiag.m_backend.data._M_elems[6] = 0;
        mindiag.m_backend.data._M_elems[7] = 0;
        mindiag.m_backend.data._M_elems[8] = 0;
        mindiag.m_backend.data._M_elems[9] = 0;
        mindiag.m_backend.data._M_elems[10] = 0;
        mindiag.m_backend.data._M_elems[0xb] = 0;
        mindiag.m_backend.data._M_elems[0xc] = 0;
        mindiag.m_backend.data._M_elems[0xd] = 0;
        mindiag.m_backend.data._M_elems[0xe] = 0;
        mindiag.m_backend.data._M_elems[0xf] = 0;
        mindiag.m_backend.data._M_elems[0x10] = 0;
        mindiag.m_backend.data._M_elems[0x11] = 0;
        mindiag.m_backend.data._M_elems[0x12] = 0;
        mindiag.m_backend.data._M_elems[0x13] = 0;
        mindiag.m_backend.data._M_elems[0x14] = 0;
        mindiag.m_backend.data._M_elems[0x15] = 0;
        mindiag.m_backend.data._M_elems[0x16] = 0;
        mindiag.m_backend.data._M_elems[0x17] = 0;
        mindiag.m_backend.data._M_elems[0x18] = 0;
        mindiag.m_backend.data._M_elems[0x19] = 0;
        mindiag.m_backend.data._M_elems._104_5_ = 0;
        mindiag.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        mindiag.m_backend.exp = 0;
        mindiag.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  (&mindiag.m_backend,(double *)&maxdiag,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)(((this->
                            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).diag.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar5));
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&local_338,&mindiag.m_backend);
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x80;
      }
    }
    else if (type == 0) {
      pnVar1 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = 0x1c;
      pnVar9 = pnVar1;
      pmVar13 = local_b0;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(uint *)pmVar13 = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar16 * -2 + 1) * 4);
        pmVar13 = pmVar13 + (ulong)bVar16 * -8 + 4;
      }
      local_40 = (pnVar1->m_backend).exp;
      local_3c = (pnVar1->m_backend).neg;
      local_38._0_4_ = (pnVar1->m_backend).fpclass;
      local_38._4_4_ = (pnVar1->m_backend).prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&mindiag,local_b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_b0);
      pnVar1 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar9 = pnVar1;
      pmVar13 = local_130;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(uint *)pmVar13 = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar16 * -2 + 1) * 4);
        pmVar13 = pmVar13 + (ulong)bVar16 * -8 + 4;
      }
      local_c0 = (pnVar1->m_backend).exp;
      local_bc = (pnVar1->m_backend).neg;
      local_b8._0_4_ = (pnVar1->m_backend).fpclass;
      local_b8._4_4_ = (pnVar1->m_backend).prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&maxdiag,local_130,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_130);
      lVar6 = 1;
      lVar5 = 0xf8;
      while( true ) {
        iVar3 = (*(this->
                  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SLinSolver[4])(this);
        if (iVar3 <= lVar6) break;
        puVar4 = (undefined8 *)
                 ((long)(((this->
                          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).diag.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar5);
        puVar10 = puVar4 + -0xf;
        pmVar13 = local_1b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined4 *)pmVar13 = *(undefined4 *)puVar10;
          puVar10 = (undefined8 *)((long)puVar10 + (ulong)bVar16 * -8 + 4);
          pmVar13 = pmVar13 + (ulong)bVar16 * -8 + 4;
        }
        local_140 = *(undefined4 *)(puVar4 + -1);
        local_13c = *(undefined1 *)((long)puVar4 + -4);
        local_138 = *puVar4;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&absdiag,local_1b0,arg);
        tVar2 = boost::multiprecision::operator<(&absdiag,&mindiag);
        pnVar8 = &mindiag;
        if (tVar2) {
LAB_003ea2a3:
          ptVar11 = &absdiag;
          ptVar14 = pnVar8;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (ptVar14->m_backend).data._M_elems[0] = (ptVar11->m_backend).data._M_elems[0];
            ptVar11 = (type *)((long)ptVar11 + ((ulong)bVar16 * -2 + 1) * 4);
            ptVar14 = (type *)((long)ptVar14 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          (pnVar8->m_backend).exp = absdiag.m_backend.exp;
          (pnVar8->m_backend).neg = absdiag.m_backend.neg;
          (pnVar8->m_backend).fpclass = absdiag.m_backend.fpclass;
          (pnVar8->m_backend).prec_elem = absdiag.m_backend.prec_elem;
        }
        else {
          pnVar8 = &maxdiag;
          tVar2 = boost::multiprecision::operator>(&absdiag,pnVar8);
          if (tVar2) goto LAB_003ea2a3;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x80;
      }
      absdiag.m_backend.fpclass = cpp_dec_float_finite;
      absdiag.m_backend.prec_elem = 0x1c;
      absdiag.m_backend.data._M_elems[0] = 0;
      absdiag.m_backend.data._M_elems[1] = 0;
      absdiag.m_backend.data._M_elems[2] = 0;
      absdiag.m_backend.data._M_elems[3] = 0;
      absdiag.m_backend.data._M_elems[4] = 0;
      absdiag.m_backend.data._M_elems[5] = 0;
      absdiag.m_backend.data._M_elems[6] = 0;
      absdiag.m_backend.data._M_elems[7] = 0;
      absdiag.m_backend.data._M_elems[8] = 0;
      absdiag.m_backend.data._M_elems[9] = 0;
      absdiag.m_backend.data._M_elems[10] = 0;
      absdiag.m_backend.data._M_elems[0xb] = 0;
      absdiag.m_backend.data._M_elems[0xc] = 0;
      absdiag.m_backend.data._M_elems[0xd] = 0;
      absdiag.m_backend.data._M_elems[0xe] = 0;
      absdiag.m_backend.data._M_elems[0xf] = 0;
      absdiag.m_backend.data._M_elems[0x10] = 0;
      absdiag.m_backend.data._M_elems[0x11] = 0;
      absdiag.m_backend.data._M_elems[0x12] = 0;
      absdiag.m_backend.data._M_elems[0x13] = 0;
      absdiag.m_backend.data._M_elems[0x14] = 0;
      absdiag.m_backend.data._M_elems[0x15] = 0;
      absdiag.m_backend.data._M_elems[0x16] = 0;
      absdiag.m_backend.data._M_elems[0x17] = 0;
      absdiag.m_backend.data._M_elems[0x18] = 0;
      absdiag.m_backend.data._M_elems[0x19] = 0;
      absdiag.m_backend.data._M_elems._104_5_ = 0;
      absdiag.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      absdiag.m_backend.exp = 0;
      absdiag.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&absdiag.m_backend,&maxdiag.m_backend,&mindiag.m_backend);
      pcVar12 = &absdiag.m_backend;
      pcVar15 = &local_338;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar15->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      local_338.exp = absdiag.m_backend.exp;
      local_338.neg = absdiag.m_backend.neg;
      local_338.fpclass = absdiag.m_backend.fpclass;
      local_338.prec_elem = absdiag.m_backend.prec_elem;
    }
    pcVar12 = &local_338;
    pnVar8 = __return_storage_ptr__;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar16 * -2 + 1) * 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar16 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = local_338.exp;
    (__return_storage_ptr__->m_backend).neg = local_338.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_338.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_338.prec_elem;
  }
  return __return_storage_ptr__;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}